

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_NoLogFiles::_Run(_Test_NoLogFiles *this)

{
  allocator local_791;
  Snapshot local_790 [4];
  undefined1 local_770 [455];
  allocator local_5a9;
  Snapshot local_5a8 [4];
  undefined1 local_588 [448];
  size_t local_3c8;
  int local_3bc;
  Tester local_3b8;
  allocator local_211;
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [424];
  _Test_NoLogFiles *local_10;
  _Test_NoLogFiles *this_local;
  
  local_10 = this;
  test::Tester::Tester
            ((Tester *)(local_1b8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xce);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"foo",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"bar",&local_211);
  RecoveryTest::Put((RecoveryTest *)local_1b8,(string *)this,(string *)local_1d8);
  test::Tester::IsOk((Tester *)(local_1b8 + 8),(Status *)local_1b8);
  Status::~Status((Status *)local_1b8);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  test::Tester::~Tester((Tester *)(local_1b8 + 8));
  test::Tester::Tester
            (&local_3b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xcf);
  local_3bc = 1;
  local_3c8 = RecoveryTest::DeleteLogFiles(&this->super_RecoveryTest);
  test::Tester::IsEq<int,unsigned_long>(&local_3b8,&local_3bc,&local_3c8);
  test::Tester::~Tester(&local_3b8);
  RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_588 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_5a8,"foo",&local_5a9);
  RecoveryTest::Get((RecoveryTest *)local_588,(string *)this,local_5a8);
  test::Tester::IsEq<char[10],std::__cxx11::string>
            ((Tester *)(local_588 + 0x20),(char (*) [10])"NOT_FOUND",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
  std::__cxx11::string::~string((string *)local_588);
  std::__cxx11::string::~string((string *)local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  test::Tester::~Tester((Tester *)(local_588 + 0x20));
  RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_770 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xd3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_790,"foo",&local_791);
  RecoveryTest::Get((RecoveryTest *)local_770,(string *)this,local_790);
  test::Tester::IsEq<char[10],std::__cxx11::string>
            ((Tester *)(local_770 + 0x20),(char (*) [10])"NOT_FOUND",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_770);
  std::__cxx11::string::~string((string *)local_770);
  std::__cxx11::string::~string((string *)local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  test::Tester::~Tester((Tester *)(local_770 + 0x20));
  return;
}

Assistant:

TEST(RecoveryTest, NoLogFiles) {
  ASSERT_OK(Put("foo", "bar"));
  ASSERT_EQ(1, DeleteLogFiles());
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
}